

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

int Cnf_SopCountLiterals(char *pSop,int nCubes)

{
  int local_24;
  int local_20;
  int b;
  int i;
  int Cube;
  int nLits;
  int nCubes_local;
  char *pSop_local;
  
  i = 0;
  for (local_20 = 0; local_20 < nCubes; local_20 = local_20 + 1) {
    b = (int)pSop[local_20];
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (b % 3 != 2) {
        i = i + 1;
      }
      b = b / 3;
    }
  }
  return i;
}

Assistant:

int Cnf_SopCountLiterals( char * pSop, int nCubes )
{
    int nLits = 0, Cube, i, b;
    for ( i = 0; i < nCubes; i++ )
    {
        Cube = pSop[i];
        for ( b = 0; b < 4; b++ )
        {
            if ( Cube % 3 != 2 )
                nLits++;
            Cube = Cube / 3;
        }
    }
    return nLits;
}